

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O3

void __thiscall cbtCollisionWorldImporter::deleteAllData(cbtCollisionWorldImporter *this)

{
  cbtCollisionWorld *pcVar1;
  cbtCollisionShape *pcVar2;
  cbtCollisionShape **ptr;
  cbtOptimizedBvh *pcVar3;
  cbtOptimizedBvh **ptr_00;
  cbtTriangleInfoMap *pcVar4;
  cbtTriangleInfoMap **ptr_01;
  cbtTriangleIndexVertexArray *pcVar5;
  cbtTriangleIndexVertexArray **ptr_02;
  char *pcVar6;
  char **ptr_03;
  cbtStridingMeshInterfaceData *pcVar7;
  cbtMeshPartData *pcVar8;
  void *pvVar9;
  cbtStridingMeshInterfaceData **ptr_04;
  int **ptr_05;
  short **ptr_06;
  uchar **ptr_07;
  cbtVector3FloatData **ptr_08;
  cbtVector3DoubleData **ptr_09;
  int iVar10;
  cbtCollisionObject **ppcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  if (0 < (this->m_allocatedCollisionObjects).m_size) {
    lVar14 = 0;
    do {
      pcVar1 = this->m_collisionWorld;
      ppcVar11 = (this->m_allocatedCollisionObjects).m_data;
      if (pcVar1 != (cbtCollisionWorld *)0x0) {
        (*pcVar1->_vptr_cbtCollisionWorld[0xb])(pcVar1,ppcVar11[lVar14]);
        ppcVar11 = (this->m_allocatedCollisionObjects).m_data;
      }
      if (ppcVar11[lVar14] != (cbtCollisionObject *)0x0) {
        (*ppcVar11[lVar14]->_vptr_cbtCollisionObject[1])();
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_allocatedCollisionObjects).m_size);
  }
  ppcVar11 = (this->m_allocatedCollisionObjects).m_data;
  if ((ppcVar11 != (cbtCollisionObject **)0x0) &&
     ((this->m_allocatedCollisionObjects).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ppcVar11);
  }
  (this->m_allocatedCollisionObjects).m_ownsMemory = true;
  (this->m_allocatedCollisionObjects).m_data = (cbtCollisionObject **)0x0;
  (this->m_allocatedCollisionObjects).m_size = 0;
  (this->m_allocatedCollisionObjects).m_capacity = 0;
  iVar10 = (this->m_allocatedCollisionShapes).m_size;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pcVar2 = (this->m_allocatedCollisionShapes).m_data[lVar14];
      if (pcVar2 != (cbtCollisionShape *)0x0) {
        (*pcVar2->_vptr_cbtCollisionShape[1])();
        iVar10 = (this->m_allocatedCollisionShapes).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar10);
  }
  ptr = (this->m_allocatedCollisionShapes).m_data;
  if ((ptr != (cbtCollisionShape **)0x0) &&
     ((this->m_allocatedCollisionShapes).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr);
  }
  (this->m_allocatedCollisionShapes).m_ownsMemory = true;
  (this->m_allocatedCollisionShapes).m_data = (cbtCollisionShape **)0x0;
  (this->m_allocatedCollisionShapes).m_size = 0;
  (this->m_allocatedCollisionShapes).m_capacity = 0;
  iVar10 = (this->m_allocatedBvhs).m_size;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pcVar3 = (this->m_allocatedBvhs).m_data[lVar14];
      if (pcVar3 != (cbtOptimizedBvh *)0x0) {
        (*(pcVar3->super_cbtQuantizedBvh)._vptr_cbtQuantizedBvh[1])();
        iVar10 = (this->m_allocatedBvhs).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar10);
  }
  ptr_00 = (this->m_allocatedBvhs).m_data;
  if ((ptr_00 != (cbtOptimizedBvh **)0x0) && ((this->m_allocatedBvhs).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr_00);
  }
  (this->m_allocatedBvhs).m_ownsMemory = true;
  (this->m_allocatedBvhs).m_data = (cbtOptimizedBvh **)0x0;
  (this->m_allocatedBvhs).m_size = 0;
  (this->m_allocatedBvhs).m_capacity = 0;
  iVar10 = (this->m_allocatedTriangleInfoMaps).m_size;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pcVar4 = (this->m_allocatedTriangleInfoMaps).m_data[lVar14];
      if (pcVar4 != (cbtTriangleInfoMap *)0x0) {
        (*pcVar4->_vptr_cbtTriangleInfoMap[1])();
        iVar10 = (this->m_allocatedTriangleInfoMaps).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar10);
  }
  ptr_01 = (this->m_allocatedTriangleInfoMaps).m_data;
  if ((ptr_01 != (cbtTriangleInfoMap **)0x0) &&
     ((this->m_allocatedTriangleInfoMaps).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr_01);
  }
  (this->m_allocatedTriangleInfoMaps).m_ownsMemory = true;
  (this->m_allocatedTriangleInfoMaps).m_data = (cbtTriangleInfoMap **)0x0;
  (this->m_allocatedTriangleInfoMaps).m_size = 0;
  (this->m_allocatedTriangleInfoMaps).m_capacity = 0;
  iVar10 = (this->m_allocatedTriangleIndexArrays).m_size;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pcVar5 = (this->m_allocatedTriangleIndexArrays).m_data[lVar14];
      if (pcVar5 != (cbtTriangleIndexVertexArray *)0x0) {
        (*(pcVar5->super_cbtStridingMeshInterface)._vptr_cbtStridingMeshInterface[1])();
        iVar10 = (this->m_allocatedTriangleIndexArrays).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar10);
  }
  ptr_02 = (this->m_allocatedTriangleIndexArrays).m_data;
  if ((ptr_02 != (cbtTriangleIndexVertexArray **)0x0) &&
     ((this->m_allocatedTriangleIndexArrays).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr_02);
  }
  (this->m_allocatedTriangleIndexArrays).m_ownsMemory = true;
  (this->m_allocatedTriangleIndexArrays).m_data = (cbtTriangleIndexVertexArray **)0x0;
  (this->m_allocatedTriangleIndexArrays).m_size = 0;
  (this->m_allocatedTriangleIndexArrays).m_capacity = 0;
  iVar10 = (this->m_allocatedNames).m_size;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pcVar6 = (this->m_allocatedNames).m_data[lVar14];
      if (pcVar6 != (char *)0x0) {
        operator_delete__(pcVar6);
        iVar10 = (this->m_allocatedNames).m_size;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar10);
  }
  ptr_03 = (this->m_allocatedNames).m_data;
  if ((ptr_03 != (char **)0x0) && ((this->m_allocatedNames).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr_03);
  }
  (this->m_allocatedNames).m_ownsMemory = true;
  (this->m_allocatedNames).m_data = (char **)0x0;
  (this->m_allocatedNames).m_size = 0;
  (this->m_allocatedNames).m_capacity = 0;
  if (0 < (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size) {
    lVar14 = 0;
    do {
      pcVar7 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data[lVar14];
      if (0 < pcVar7->m_numMeshParts) {
        lVar12 = 0x28;
        lVar13 = 0;
        do {
          pcVar8 = pcVar7->m_meshPartsPtr;
          pvVar9 = *(void **)((long)pcVar8 + lVar12 + -0x28);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          pvVar9 = *(void **)((long)pcVar8 + lVar12 + -0x20);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          pvVar9 = *(void **)((long)pcVar8 + lVar12 + -0x18);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          pvVar9 = *(void **)((long)pcVar8 + lVar12 + -0x10);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          pvVar9 = *(void **)((long)&pcVar8->m_vertices3f + lVar12);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          pvVar9 = *(void **)((long)pcVar8 + lVar12 + -8);
          if (pvVar9 != (void *)0x0) {
            operator_delete__(pvVar9);
          }
          lVar13 = lVar13 + 1;
          lVar12 = lVar12 + 0x38;
        } while (lVar13 < pcVar7->m_numMeshParts);
      }
      if (pcVar7->m_meshPartsPtr != (cbtMeshPartData *)0x0) {
        operator_delete__(pcVar7->m_meshPartsPtr);
      }
      operator_delete(pcVar7,0x20);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size);
  }
  ptr_04 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data;
  if ((ptr_04 != (cbtStridingMeshInterfaceData **)0x0) &&
     ((this->m_allocatedcbtStridingMeshInterfaceDatas).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr_04);
  }
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_ownsMemory = true;
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data = (cbtStridingMeshInterfaceData **)0x0;
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size = 0;
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_capacity = 0;
  if (0 < (this->m_indexArrays).m_size) {
    lVar14 = 0;
    do {
      cbtAlignedFreeInternal((this->m_indexArrays).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_indexArrays).m_size);
  }
  ptr_05 = (this->m_indexArrays).m_data;
  if ((ptr_05 != (int **)0x0) && ((this->m_indexArrays).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr_05);
  }
  (this->m_indexArrays).m_ownsMemory = true;
  (this->m_indexArrays).m_data = (int **)0x0;
  (this->m_indexArrays).m_size = 0;
  (this->m_indexArrays).m_capacity = 0;
  if (0 < (this->m_shortIndexArrays).m_size) {
    lVar14 = 0;
    do {
      cbtAlignedFreeInternal((this->m_shortIndexArrays).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_shortIndexArrays).m_size);
  }
  ptr_06 = (this->m_shortIndexArrays).m_data;
  if ((ptr_06 != (short **)0x0) && ((this->m_shortIndexArrays).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr_06);
  }
  (this->m_shortIndexArrays).m_ownsMemory = true;
  (this->m_shortIndexArrays).m_data = (short **)0x0;
  (this->m_shortIndexArrays).m_size = 0;
  (this->m_shortIndexArrays).m_capacity = 0;
  if (0 < (this->m_charIndexArrays).m_size) {
    lVar14 = 0;
    do {
      cbtAlignedFreeInternal((this->m_charIndexArrays).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_charIndexArrays).m_size);
  }
  ptr_07 = (this->m_charIndexArrays).m_data;
  if ((ptr_07 != (uchar **)0x0) && ((this->m_charIndexArrays).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr_07);
  }
  (this->m_charIndexArrays).m_ownsMemory = true;
  (this->m_charIndexArrays).m_data = (uchar **)0x0;
  (this->m_charIndexArrays).m_size = 0;
  (this->m_charIndexArrays).m_capacity = 0;
  if (0 < (this->m_floatVertexArrays).m_size) {
    lVar14 = 0;
    do {
      cbtAlignedFreeInternal((this->m_floatVertexArrays).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_floatVertexArrays).m_size);
  }
  ptr_08 = (this->m_floatVertexArrays).m_data;
  if ((ptr_08 != (cbtVector3FloatData **)0x0) && ((this->m_floatVertexArrays).m_ownsMemory == true))
  {
    cbtAlignedFreeInternal(ptr_08);
  }
  (this->m_floatVertexArrays).m_ownsMemory = true;
  (this->m_floatVertexArrays).m_data = (cbtVector3FloatData **)0x0;
  (this->m_floatVertexArrays).m_size = 0;
  (this->m_floatVertexArrays).m_capacity = 0;
  if (0 < (this->m_doubleVertexArrays).m_size) {
    lVar14 = 0;
    do {
      cbtAlignedFreeInternal((this->m_doubleVertexArrays).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->m_doubleVertexArrays).m_size);
  }
  ptr_09 = (this->m_doubleVertexArrays).m_data;
  if ((ptr_09 != (cbtVector3DoubleData **)0x0) &&
     ((this->m_doubleVertexArrays).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr_09);
  }
  (this->m_doubleVertexArrays).m_ownsMemory = true;
  (this->m_doubleVertexArrays).m_data = (cbtVector3DoubleData **)0x0;
  (this->m_doubleVertexArrays).m_size = 0;
  (this->m_doubleVertexArrays).m_capacity = 0;
  return;
}

Assistant:

void cbtCollisionWorldImporter::deleteAllData()
{
	int i;

	for (i = 0; i < m_allocatedCollisionObjects.size(); i++)
	{
		if (m_collisionWorld)
			m_collisionWorld->removeCollisionObject(m_allocatedCollisionObjects[i]);
		delete m_allocatedCollisionObjects[i];
	}

	m_allocatedCollisionObjects.clear();

	for (i = 0; i < m_allocatedCollisionShapes.size(); i++)
	{
		delete m_allocatedCollisionShapes[i];
	}
	m_allocatedCollisionShapes.clear();

	for (i = 0; i < m_allocatedBvhs.size(); i++)
	{
		delete m_allocatedBvhs[i];
	}
	m_allocatedBvhs.clear();

	for (i = 0; i < m_allocatedTriangleInfoMaps.size(); i++)
	{
		delete m_allocatedTriangleInfoMaps[i];
	}
	m_allocatedTriangleInfoMaps.clear();
	for (i = 0; i < m_allocatedTriangleIndexArrays.size(); i++)
	{
		delete m_allocatedTriangleIndexArrays[i];
	}
	m_allocatedTriangleIndexArrays.clear();
	for (i = 0; i < m_allocatedNames.size(); i++)
	{
		delete[] m_allocatedNames[i];
	}
	m_allocatedNames.clear();

	for (i = 0; i < m_allocatedcbtStridingMeshInterfaceDatas.size(); i++)
	{
		cbtStridingMeshInterfaceData* curData = m_allocatedcbtStridingMeshInterfaceDatas[i];

		for (int a = 0; a < curData->m_numMeshParts; a++)
		{
			cbtMeshPartData* curPart = &curData->m_meshPartsPtr[a];
			if (curPart->m_vertices3f)
				delete[] curPart->m_vertices3f;

			if (curPart->m_vertices3d)
				delete[] curPart->m_vertices3d;

			if (curPart->m_indices32)
				delete[] curPart->m_indices32;

			if (curPart->m_3indices16)
				delete[] curPart->m_3indices16;

			if (curPart->m_indices16)
				delete[] curPart->m_indices16;

			if (curPart->m_3indices8)
				delete[] curPart->m_3indices8;
		}
		delete[] curData->m_meshPartsPtr;
		delete curData;
	}
	m_allocatedcbtStridingMeshInterfaceDatas.clear();

	for (i = 0; i < m_indexArrays.size(); i++)
	{
		cbtAlignedFree(m_indexArrays[i]);
	}
	m_indexArrays.clear();

	for (i = 0; i < m_shortIndexArrays.size(); i++)
	{
		cbtAlignedFree(m_shortIndexArrays[i]);
	}
	m_shortIndexArrays.clear();

	for (i = 0; i < m_charIndexArrays.size(); i++)
	{
		cbtAlignedFree(m_charIndexArrays[i]);
	}
	m_charIndexArrays.clear();

	for (i = 0; i < m_floatVertexArrays.size(); i++)
	{
		cbtAlignedFree(m_floatVertexArrays[i]);
	}
	m_floatVertexArrays.clear();

	for (i = 0; i < m_doubleVertexArrays.size(); i++)
	{
		cbtAlignedFree(m_doubleVertexArrays[i]);
	}
	m_doubleVertexArrays.clear();
}